

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long *plVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long lVar5;
  bool bVar6;
  Vector *result_00;
  LogicalType *type;
  Vector *this;
  Vector *pVVar7;
  long *plVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  idx_t bin_idx;
  ulong uVar12;
  long lVar13;
  idx_t offset_00;
  string_t value;
  UnifiedVectorFormat sdata;
  Value local_70;
  
  offset_00 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat(state_vector,count,&sdata);
  FlatVector::VerifyFlatVector(result);
  result_00 = (Vector *)ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar6 = SupportsOtherBucket(type);
  lVar13 = 0;
  for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
    iVar10 = iVar9;
    if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
      iVar10 = (idx_t)(sdata.sel)->sel_vector[iVar9];
    }
    plVar2 = (long *)**(long **)(sdata.data + iVar10 * 8);
    if (plVar2 != (long *)0x0) {
      offset_00 = (plVar2[1] - *plVar2 >> 4) + lVar13;
      lVar13 = (*(long *)(*(long *)((*(long **)(sdata.data + iVar10 * 8))[1] + 8) + -8) != 0 &&
               bVar6) + offset_00;
    }
  }
  ListVector::Reserve(result,(idx_t)(&result_00->vector_type + lVar13));
  this = MapVector::GetKeys(result);
  pVVar7 = MapVector::GetValues(result);
  pdVar3 = result->data;
  pdVar4 = pVVar7->data;
  for (uVar11 = 0; uVar11 != count; uVar11 = uVar11 + 1) {
    uVar12 = uVar11;
    if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar12 = (ulong)(sdata.sel)->sel_vector[uVar11];
    }
    plVar2 = *(long **)(sdata.data + uVar12 * 8);
    plVar8 = (long *)*plVar2;
    if (plVar8 == (long *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar11 + offset);
    }
    else {
      lVar13 = (uVar11 + offset) * 0x10;
      plVar1 = (long *)(pdVar3 + lVar13);
      *(Vector **)(pdVar3 + lVar13) = result_00;
      lVar13 = 8;
      for (uVar12 = 0; lVar5 = *plVar8, uVar12 < (ulong)(plVar8[1] - lVar5 >> 4);
          uVar12 = uVar12 + 1) {
        value.value.pointer.ptr = (char *)this;
        value.value._0_8_ = *(undefined8 *)(lVar5 + lVar13);
        HistogramStringFunctor::HistogramFinalize<duckdb::string_t>
                  (*(HistogramStringFunctor **)(lVar5 + -8 + lVar13),value,result_00,offset_00);
        *(undefined8 *)(pdVar4 + (long)result_00 * 8) =
             *(undefined8 *)(*(long *)plVar2[1] + uVar12 * 8);
        result_00 = (Vector *)&result_00->field_0x1;
        plVar8 = (long *)*plVar2;
        lVar13 = lVar13 + 0x10;
      }
      if (bVar6 && *(long *)(*(long *)(plVar2[1] + 8) + -8) != 0) {
        OtherBucketValue(&local_70,&this->type);
        Vector::SetValue(this,(idx_t)result_00,&local_70);
        Value::~Value(&local_70);
        *(undefined8 *)(pdVar4 + (long)result_00 * 8) =
             *(undefined8 *)(*(long *)(plVar2[1] + 8) + -8);
        result_00 = (Vector *)&result_00->field_0x1;
      }
      plVar1[1] = (long)result_00 - *plVar1;
    }
  }
  ListVector::SetListSize(result,(idx_t)result_00);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}